

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_write_stats.hpp
# Opt level: O0

string * __thiscall
duckdb::NumericStatisticsState<unsigned_long,unsigned_long,duckdb::BaseParquetOperator>::
GetMinValue_abi_cxx11_
          (NumericStatisticsState<unsigned_long,_unsigned_long,_duckdb::BaseParquetOperator> *this)

{
  ulong uVar1;
  char *pcVar2;
  long *in_RSI;
  string *in_RDI;
  allocator local_11 [17];
  
  uVar1 = (**(code **)(*in_RSI + 0x10))();
  if ((uVar1 & 1) == 0) {
    ::std::__cxx11::string::string((string *)in_RDI);
  }
  else {
    pcVar2 = char_ptr_cast<unsigned_long>((unsigned_long *)(in_RSI + 1));
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,pcVar2,8,local_11);
    ::std::allocator<char>::~allocator((allocator<char> *)local_11);
  }
  return in_RDI;
}

Assistant:

string GetMinValue() override {
		return HasStats() ? string(char_ptr_cast(&min), sizeof(T)) : string();
	}